

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditBuildInfoTests.cpp
# Opt level: O2

IterateResult __thiscall dit::EndiannessConsistencyCase::iterate(EndiannessConsistencyCase *this)

{
  ostringstream *this_00;
  MessageBuilder local_190;
  
  local_190.m_log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  this_00 = &local_190.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Verifying DE_ENDIANNESS matches actual behavior");
  tcu::MessageBuilder::operator<<(&local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const deUint16	multiByte	= (deUint16)0x0102;

#if DE_ENDIANNESS == DE_BIG_ENDIAN
		const bool		isOk		= *((const deUint8*)&multiByte) == (deUint8)0x01;
#elif DE_ENDIANNESS == DE_LITTLE_ENDIAN
		const bool		isOk		= *((const deUint8*)&multiByte) == (deUint8)0x02;
#endif

		m_testCtx.getLog()
			<< TestLog::Message
			<< "Verifying DE_ENDIANNESS matches actual behavior"
			<< TestLog::EndMessage;

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Configured endianness inconsistent");
		return STOP;
	}